

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_object.cxx
# Opt level: O3

bool __thiscall xray_re::xr_object::load_object(xr_object *this,char *path)

{
  int iVar1;
  xr_reader *this_00;
  bool bVar2;
  xr_reader *s;
  xr_reader *local_28;
  
  if ((xr_file_system::instance()::instance0 == '\0') &&
     (iVar1 = __cxa_guard_acquire(&xr_file_system::instance()::instance0), iVar1 != 0)) {
    xr_file_system::xr_file_system(&xr_file_system::instance::instance0);
    __cxa_atexit(xr_file_system::~xr_file_system,&xr_file_system::instance::instance0,&__dso_handle)
    ;
    __cxa_guard_release(&xr_file_system::instance()::instance0);
  }
  this_00 = xr_file_system::r_open(&xr_file_system::instance::instance0,path);
  if (this_00 == (xr_reader *)0x0) {
    bVar2 = false;
  }
  else {
    local_28 = xr_reader::open_chunk(this_00,0x7777);
    bVar2 = local_28 != (xr_reader *)0x0;
    if (bVar2) {
      (*(this->super_xr_surface_factory)._vptr_xr_surface_factory[8])(this,local_28);
      xr_reader::close_chunk(this_00,&local_28);
    }
    (*this_00->_vptr_xr_reader[1])(this_00);
  }
  return bVar2;
}

Assistant:

bool xr_object::load_object(const char* path)
{
	xr_file_system& fs = xr_file_system::instance();
	xr_reader* r = fs.r_open(path);
	if (r == 0)
		return false;
	bool status = false;
	xr_reader* s = r->open_chunk(EOBJ_CHUNK_MAIN);
	if (s) {
		try {
			load_object(*s);
			status = true;
		} catch (xr_error) {
			clear();
		}
		r->close_chunk(s);
	}
	fs.r_close(r);
	return status;
}